

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Globals.cpp
# Opt level: O1

bool __thiscall OpenMD::Globals::addMoleculeStamp(Globals *this,MoleculeStamp *molStamp)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  iterator iVar3;
  ostream *poVar4;
  OpenMDException *this_00;
  string molStampName;
  ostringstream oss;
  string local_1e8;
  key_type local_1c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>
  local_1a8 [9];
  
  pcVar2 = (molStamp->Name).data_._M_dataplus._M_p;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar2,pcVar2 + (molStamp->Name).data_._M_string_length);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::MoleculeStamp_*>_>_>
          ::find(&(this->moleculeStamps_)._M_t,&local_1c8);
  if ((_Rb_tree_header *)iVar3._M_node ==
      &(this->moleculeStamps_)._M_t._M_impl.super__Rb_tree_header) {
    paVar1 = &local_1a8[0].first.field_2;
    local_1a8[0].first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_1c8._M_dataplus._M_p,
               local_1c8._M_dataplus._M_p + local_1c8._M_string_length);
    local_1a8[0].second = molStamp;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::MoleculeStamp*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::MoleculeStamp*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::MoleculeStamp*>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::MoleculeStamp*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::MoleculeStamp*>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::MoleculeStamp*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::MoleculeStamp*>>>
                *)&this->moleculeStamps_,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0].first._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8[0].first._M_dataplus._M_p,
                      local_1a8[0].first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    return true;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Globals Error: Molecule Stamp ",0x1e);
  pcVar2 = (molStamp->Name).data_._M_dataplus._M_p;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar2,pcVar2 + (molStamp->Name).data_._M_string_length);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"appears multiple times\n",0x17);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  this_00 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  OpenMDException::OpenMDException(this_00,&local_1e8);
  __cxa_throw(this_00,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

bool Globals::addMoleculeStamp(MoleculeStamp* molStamp) {
    std::string molStampName = molStamp->getName();
    std::map<std::string, MoleculeStamp*>::iterator i;
    bool ret = false;
    i        = moleculeStamps_.find(molStampName);
    if (i == moleculeStamps_.end()) {
      moleculeStamps_.insert(std::map<std::string, MoleculeStamp*>::value_type(
          molStampName, molStamp));
      ret = true;
    } else {
      std::ostringstream oss;
      oss << "Globals Error: Molecule Stamp " << molStamp->getName()
          << "appears multiple times\n";
      throw OpenMDException(oss.str());
    }
    return ret;
  }